

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::DisconnectTip
          (Chainstate *this,BlockValidationState *state,
          DisconnectedBlockTransactions *disconnectpool)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar2;
  undefined1 uVar3;
  DisconnectResult DVar4;
  Chainstate *this_00;
  element_type *block_00;
  CTxMemPool *this_01;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *evicted_tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>
  *prune_lock;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
  *__range1;
  bool flushed;
  CBlock *block;
  CBlockIndex *pindexDelete;
  iterator __end2;
  iterator __begin2;
  iterator __end1;
  iterator __begin1;
  int max_height_first;
  time_point time_start;
  shared_ptr<CBlock> pblock;
  CCoinsViewCache view;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  char *in_stack_fffffffffffffb90;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffb98;
  CBlockIndex *in_stack_fffffffffffffba0;
  Chainstate *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbc8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffffbd0;
  undefined6 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbde;
  undefined1 in_stack_fffffffffffffbdf;
  CBlockIndex *in_stack_fffffffffffffbe0;
  type in_stack_fffffffffffffbe8;
  undefined6 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf6;
  undefined1 in_stack_fffffffffffffbf7;
  int in_stack_fffffffffffffbfc;
  int source_line;
  undefined8 in_stack_fffffffffffffc30;
  ConstevalFormatString<2U> in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc40;
  type in_stack_fffffffffffffc48;
  CBlockIndex *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  CBlockIndex *in_stack_fffffffffffffc60;
  char *pcVar5;
  undefined4 in_stack_fffffffffffffc68;
  int iVar6;
  CCoinsViewCache *in_stack_fffffffffffffc78;
  CBlockIndex *in_stack_fffffffffffffc80;
  byte local_349;
  int local_2dc;
  undefined8 local_2d8;
  Level level;
  CCoinsView in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  int *in_stack_fffffffffffffd48;
  FlushStateMode in_stack_fffffffffffffe5c;
  CoinsCachePair *in_stack_fffffffffffffe60;
  Chainstate *in_stack_fffffffffffffe68;
  int in_stack_ffffffffffffff54;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffb98.__r,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb8c,(AnnotatedMixin<std::recursive_mutex> *)0x1493cc3);
  if (*(long *)(in_RDI + 0x28) != 0) {
    AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
              ((char *)in_stack_fffffffffffffb98.__r,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb8c,(AnnotatedMixin<std::recursive_mutex> *)0x1493cfa);
  }
  this_00 = (Chainstate *)CChain::Tip((CChain *)in_stack_fffffffffffffb98.__r);
  if (this_00 == (Chainstate *)0x0) {
    __assert_fail("pindexDelete",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd0,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  if (*(CBlockIndex **)
       ((long)&(this_00->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex + 8) ==
      (CBlockIndex *)0x0) {
    __assert_fail("pindexDelete->pprev",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd1,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  std::make_shared<CBlock>();
  block_00 = std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        in_stack_fffffffffffffb98.__r);
  bVar2 = ::node::BlockManager::ReadBlockFromDisk
                    ((BlockManager *)
                     CONCAT17(in_stack_fffffffffffffbf7,
                              CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                     (CBlock *)in_stack_fffffffffffffbe8.__r,in_stack_fffffffffffffbe0);
  level = (Level)in_stack_fffffffffffffd30._vptr_CCoinsView;
  if (bVar2) {
    std::chrono::_V2::steady_clock::now();
    CoinsTip(in_stack_fffffffffffffba8);
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)
               CONCAT17(in_stack_fffffffffffffbdf,
                        CONCAT16(in_stack_fffffffffffffbde,in_stack_fffffffffffffbd8)),
               (CCoinsView *)in_stack_fffffffffffffbd0,(bool)uVar3);
    CCoinsViewCache::GetBestBlock((CCoinsViewCache *)in_stack_fffffffffffffb98.__r);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffb98.__r);
    bVar2 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb98.__r,
                         (base_blob<256U> *)in_stack_fffffffffffffb90);
    source_line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbfc);
    if (!bVar2) {
      __assert_fail("view.GetBestBlock() == pindexDelete->GetBlockHash()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xbdd,
                    "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                   );
    }
    DVar4 = DisconnectBlock(this_00,block_00,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    if (DVar4 == DISCONNECT_OK) {
      in_stack_fffffffffffffbf7 =
           CCoinsViewCache::Flush((CCoinsViewCache *)in_stack_fffffffffffffb98.__r);
      if (!(bool)in_stack_fffffffffffffbf7) {
        __assert_fail("flushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xbe3,
                      "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                     );
      }
      iVar6 = 0;
      in_stack_fffffffffffffc5f = in_stack_fffffffffffffbf7;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
                 (char *)in_stack_fffffffffffffba0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
                 (char *)in_stack_fffffffffffffba0);
      pcVar5 = "DisconnectTip(): DisconnectBlock %s failed\n";
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffb98.__r);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb90);
      in_stack_fffffffffffffb90 = pcVar5;
      in_stack_fffffffffffffb98.__r = (rep)&stack0xfffffffffffffdd0;
      in_stack_fffffffffffffb88 = 4;
      logging_function_00._M_str._0_7_ = in_stack_fffffffffffffc58;
      logging_function_00._M_len = (size_t)in_stack_fffffffffffffc50;
      logging_function_00._M_str._7_1_ = in_stack_fffffffffffffc5f;
      source_file_00._M_str = (char *)in_stack_fffffffffffffc48.__r;
      source_file_00._M_len = in_stack_fffffffffffffc40;
      in_stack_fffffffffffffc60 = (CBlockIndex *)in_stack_fffffffffffffb90;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,source_line,
                 CONCAT17(in_stack_fffffffffffffbf7,
                          CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                 (Level)in_stack_fffffffffffffd30._vptr_CCoinsView,
                 (ConstevalFormatString<1U>)in_stack_fffffffffffffc38.fmt,in_stack_fffffffffffffd40)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_349 = 0;
      iVar6 = 1;
    }
    CCoinsViewCache::~CCoinsViewCache
              ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (iVar6 == 0) {
      uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                                  Trace);
      if ((bool)uVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
                   (char *)in_stack_fffffffffffffba0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
                   (char *)in_stack_fffffffffffffba0);
        pcVar5 = "- Disconnect block: %.2fms\n";
        local_2d8 = std::chrono::_V2::steady_clock::now();
        in_stack_fffffffffffffbe8 =
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffb90,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        in_stack_fffffffffffffc48 = in_stack_fffffffffffffbe8;
        in_stack_fffffffffffffb90 = pcVar5;
        in_stack_fffffffffffffbe0 =
             (CBlockIndex *)
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       (in_stack_fffffffffffffb98);
        in_stack_fffffffffffffb98.__r = (rep)&stack0xfffffffffffffd30;
        in_stack_fffffffffffffb88 = 1;
        logging_function_01._M_str._0_7_ = in_stack_fffffffffffffc58;
        logging_function_01._M_len = (size_t)in_stack_fffffffffffffb90;
        logging_function_01._M_str._7_1_ = in_stack_fffffffffffffc5f;
        source_file_01._M_str = (char *)in_stack_fffffffffffffc48.__r;
        source_file_01._M_len = in_stack_fffffffffffffc40;
        in_stack_fffffffffffffc50 = (CBlockIndex *)in_stack_fffffffffffffb90;
        in_stack_fffffffffffffd30._vptr_CCoinsView = (_func_int **)in_stack_fffffffffffffbe0;
        LogPrintFormatInternal<double>
                  (logging_function_01,source_file_01,source_line,
                   CONCAT17(in_stack_fffffffffffffbf7,CONCAT16(uVar3,in_stack_fffffffffffffbf0)),
                   (Level)in_stack_fffffffffffffbe0,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffc38.fmt,
                   (double *)in_stack_fffffffffffffd40);
      }
      local_2dc = *(int *)((long)&(this_00->m_chainstate_mutex).super_mutex.super___mutex_base.
                                  _M_mutex + 0x18) + -1;
      this_01 = (CTxMemPool *)(*(long *)(in_RDI + 0x48) + 0xd8);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
      ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
               *)in_stack_fffffffffffffb90);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
      ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
             *)in_stack_fffffffffffffb90);
      while (bVar2 = std::__detail::operator==
                               ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
                                 *)in_stack_fffffffffffffb98.__r,
                                (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
                                 *)in_stack_fffffffffffffb90), ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffc38.fmt =
             (char *)std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                     ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                                  *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        if (local_2dc <
            *(int *)&(((CTransaction *)in_stack_fffffffffffffc38.fmt)->vout).
                     super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
          *(int *)&(((CTransaction *)in_stack_fffffffffffffc38.fmt)->vout).
                   super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_2dc;
          in_stack_fffffffffffffbdf =
               ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                                   Trace);
          if ((bool)in_stack_fffffffffffffbdf) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8
                       ,(char *)in_stack_fffffffffffffba0);
            in_stack_fffffffffffffb98.__r = (rep)in_stack_fffffffffffffc38.fmt;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8
                       ,(char *)in_stack_fffffffffffffba0);
            in_stack_fffffffffffffc30 = 0;
            in_stack_fffffffffffffba0 = (CBlockIndex *)&local_2dc;
            in_stack_fffffffffffffb90 = "%s prune lock moved back to %d\n";
            in_stack_fffffffffffffb88 = 1;
            logging_function_02._M_str._0_7_ = in_stack_fffffffffffffc58;
            logging_function_02._M_len = (size_t)in_stack_fffffffffffffc50;
            logging_function_02._M_str._7_1_ = in_stack_fffffffffffffc5f;
            source_file_02._M_str = (char *)in_stack_fffffffffffffc48.__r;
            source_file_02._M_len = (size_t)this_01;
            in_stack_fffffffffffffc38.fmt = (char *)in_stack_fffffffffffffb98.__r;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_02,source_file_02,source_line,
                       CONCAT17(in_stack_fffffffffffffbf7,CONCAT16(uVar3,in_stack_fffffffffffffbf0))
                       ,(Level)in_stack_fffffffffffffd30._vptr_CCoinsView,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffffb98.__r,
                       in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
          }
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                      *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      }
      bVar2 = FlushStateToDisk(in_stack_fffffffffffffe68,
                               (BlockValidationState *)in_stack_fffffffffffffe60,
                               in_stack_fffffffffffffe5c,in_stack_ffffffffffffff54);
      if (bVar2) {
        if ((in_RDX != 0) && (*(long *)(in_RDI + 0x28) != 0)) {
          DisconnectedBlockTransactions::AddTransactionsFromBlock
                    ((DisconnectedBlockTransactions *)
                     CONCAT17(in_stack_fffffffffffffbdf,CONCAT16(bVar2,in_stack_fffffffffffffbd8)),
                     in_stack_fffffffffffffbd0);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffffb90);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffb90);
          while (bVar2 = __gnu_cxx::
                         operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                     *)in_stack_fffffffffffffb98.__r,
                                    (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                     *)in_stack_fffffffffffffb90), ((bVar2 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
            ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffffb98.__r);
            CTxMemPool::removeRecursive
                      (this_01,(CTransaction *)in_stack_fffffffffffffc38.fmt,
                       (MemPoolRemovalReason)((ulong)in_stack_fffffffffffffc30 >> 0x20));
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
            ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          }
          iVar6 = 8;
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffffb98.__r);
        }
        CChain::SetTip((CChain *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
        UpdateTip((Chainstate *)CONCAT44(iVar6,in_stack_fffffffffffffc68),in_stack_fffffffffffffc60)
        ;
        if (*(long *)(*(long *)(in_RDI + 0x50) + 0x7d8) != 0) {
          std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
                    ((shared_ptr<const_CBlock> *)
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                     (shared_ptr<CBlock> *)0x14945c1);
          ValidationSignals::BlockDisconnected
                    ((ValidationSignals *)
                     CONCAT17(in_stack_fffffffffffffbf7,CONCAT16(uVar3,in_stack_fffffffffffffbf0)),
                     (shared_ptr<const_CBlock> *)in_stack_fffffffffffffbe8.__r,
                     in_stack_fffffffffffffbe0);
          std::shared_ptr<const_CBlock>::~shared_ptr
                    ((shared_ptr<const_CBlock> *)
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        }
        local_349 = 1;
      }
      else {
        local_349 = 0;
      }
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
               (char *)in_stack_fffffffffffffba0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8,
               (char *)in_stack_fffffffffffffba0);
    in_stack_fffffffffffffb88 = 4;
    logging_function._M_str._0_7_ = in_stack_fffffffffffffc58;
    logging_function._M_len = (size_t)in_stack_fffffffffffffc50;
    logging_function._M_str._7_1_ = in_stack_fffffffffffffc5f;
    source_file._M_str = (char *)in_stack_fffffffffffffc48.__r;
    source_file._M_len = in_stack_fffffffffffffc40;
    LogPrintFormatInternal<>
              (logging_function,source_file,in_stack_fffffffffffffbfc,
               CONCAT17(in_stack_fffffffffffffbf7,
                        CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),level,
               (ConstevalFormatString<0U>)in_stack_fffffffffffffc38.fmt);
    local_349 = 0;
  }
  std::shared_ptr<CBlock>::~shared_ptr
            ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_349 & 1);
}

Assistant:

bool Chainstate::DisconnectTip(BlockValidationState& state, DisconnectedBlockTransactions* disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    CBlockIndex *pindexDelete = m_chain.Tip();
    assert(pindexDelete);
    assert(pindexDelete->pprev);
    // Read block from disk.
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    CBlock& block = *pblock;
    if (!m_blockman.ReadBlockFromDisk(block, *pindexDelete)) {
        LogError("DisconnectTip(): Failed to read block\n");
        return false;
    }
    // Apply the block atomically to the chain state.
    const auto time_start{SteadyClock::now()};
    {
        CCoinsViewCache view(&CoinsTip());
        assert(view.GetBestBlock() == pindexDelete->GetBlockHash());
        if (DisconnectBlock(block, pindexDelete, view) != DISCONNECT_OK) {
            LogError("DisconnectTip(): DisconnectBlock %s failed\n", pindexDelete->GetBlockHash().ToString());
            return false;
        }
        bool flushed = view.Flush();
        assert(flushed);
    }
    LogDebug(BCLog::BENCH, "- Disconnect block: %.2fms\n",
             Ticks<MillisecondsDouble>(SteadyClock::now() - time_start));

    {
        // Prune locks that began at or after the tip should be moved backward so they get a chance to reorg
        const int max_height_first{pindexDelete->nHeight - 1};
        for (auto& prune_lock : m_blockman.m_prune_locks) {
            if (prune_lock.second.height_first <= max_height_first) continue;

            prune_lock.second.height_first = max_height_first;
            LogDebug(BCLog::PRUNE, "%s prune lock moved back to %d\n", prune_lock.first, max_height_first);
        }
    }

    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }

    if (disconnectpool && m_mempool) {
        // Save transactions to re-add to mempool at end of reorg. If any entries are evicted for
        // exceeding memory limits, remove them and their descendants from the mempool.
        for (auto&& evicted_tx : disconnectpool->AddTransactionsFromBlock(block.vtx)) {
            m_mempool->removeRecursive(*evicted_tx, MemPoolRemovalReason::REORG);
        }
    }

    m_chain.SetTip(*pindexDelete->pprev);

    UpdateTip(pindexDelete->pprev);
    // Let wallets know transactions went from 1-confirmed to
    // 0-confirmed or conflicted:
    if (m_chainman.m_options.signals) {
        m_chainman.m_options.signals->BlockDisconnected(pblock, pindexDelete);
    }
    return true;
}